

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_trotter.cpp
# Opt level: O1

void trotter<std::complex<float>>
               (QCircuit<std::complex<float>,_qclab::QObject<std::complex<float>_>_> *circuit)

{
  int qubit;
  QRotationGate1<std::complex<float>_> *pQVar1;
  CX<std::complex<float>_> *pCVar2;
  uint qubit_00;
  int iVar3;
  uint qubit_01;
  _Head_base<0UL,_qclab::QObject<std::complex<float>_>_*,_false> local_80;
  _Head_base<0UL,_qclab::QObject<std::complex<float>_>_*,_false> local_78;
  _Head_base<0UL,_qclab::QObject<std::complex<float>_>_*,_false> local_70;
  _Head_base<0UL,_qclab::QObject<std::complex<float>_>_*,_false> local_68;
  _Head_base<0UL,_qclab::QObject<std::complex<float>_>_*,_false> local_60;
  _Head_base<0UL,_qclab::QObject<std::complex<float>_>_*,_false> local_58;
  _Head_base<0UL,_qclab::QObject<std::complex<float>_>_*,_false> local_50;
  _Head_base<0UL,_qclab::QObject<std::complex<float>_>_*,_false> local_48;
  _Head_base<0UL,_qclab::QObject<std::complex<float>_>_*,_false> local_40;
  uint local_38;
  uint local_34;
  
  local_38 = (**(circuit->super_QObject<std::complex<float>_>)._vptr_QObject)();
  if (0 < (int)local_38) {
    local_34 = 0;
    do {
      iVar3 = local_38 - ((local_34 ^ local_38) & 1);
      qubit_00 = local_34 & 1;
      for (qubit_01 = qubit_00; (int)qubit_01 < iVar3; qubit_01 = qubit_01 + 1) {
        pQVar1 = (QRotationGate1<std::complex<float>_> *)operator_new(0x18);
        qclab::qgates::QRotationGate1<std::complex<float>_>::QRotationGate1
                  (pQVar1,qubit_01,3.1415927,false);
        (pQVar1->super_QGate1<std::complex<float>_>).super_QObject<std::complex<float>_>.
        _vptr_QObject = (_func_int **)&PTR_nbQubits_00122d28;
        local_40._M_head_impl = (QObject<std::complex<float>_> *)pQVar1;
        qclab::QCircuit<std::complex<float>,_qclab::QObject<std::complex<float>_>_>::push_back
                  (circuit,(unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>
                            *)&local_40);
        if ((QRotationGate1<std::complex<float>_> *)local_40._M_head_impl !=
            (QRotationGate1<std::complex<float>_> *)0x0) {
          (*(((QGate1<std::complex<float>_> *)&(local_40._M_head_impl)->_vptr_QObject)->
            super_QObject<std::complex<float>_>)._vptr_QObject[0xd])();
        }
        local_40._M_head_impl = (QObject<std::complex<float>_> *)0x0;
      }
      for (; (int)qubit_00 < iVar3 + -1; qubit_00 = qubit_00 + 2) {
        pQVar1 = (QRotationGate1<std::complex<float>_> *)operator_new(0x18);
        qclab::qgates::QRotationGate1<std::complex<float>_>::QRotationGate1
                  (pQVar1,qubit_00,1.5707964,false);
        (pQVar1->super_QGate1<std::complex<float>_>).super_QObject<std::complex<float>_>.
        _vptr_QObject = (_func_int **)&PTR_nbQubits_00122f28;
        local_48._M_head_impl = (QObject<std::complex<float>_> *)pQVar1;
        qclab::QCircuit<std::complex<float>,_qclab::QObject<std::complex<float>_>_>::push_back
                  (circuit,(unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>
                            *)&local_48);
        if ((QRotationGate1<std::complex<float>_> *)local_48._M_head_impl !=
            (QRotationGate1<std::complex<float>_> *)0x0) {
          (*(((QGate1<std::complex<float>_> *)&(local_48._M_head_impl)->_vptr_QObject)->
            super_QObject<std::complex<float>_>)._vptr_QObject[0xd])();
        }
        local_48._M_head_impl = (QObject<std::complex<float>_> *)0x0;
        qubit = qubit_00 + 1;
        pQVar1 = (QRotationGate1<std::complex<float>_> *)operator_new(0x18);
        qclab::qgates::QRotationGate1<std::complex<float>_>::QRotationGate1
                  (pQVar1,qubit,1.5707964,false);
        (pQVar1->super_QGate1<std::complex<float>_>).super_QObject<std::complex<float>_>.
        _vptr_QObject = (_func_int **)&PTR_nbQubits_00122f28;
        local_50._M_head_impl = (QObject<std::complex<float>_> *)pQVar1;
        qclab::QCircuit<std::complex<float>,_qclab::QObject<std::complex<float>_>_>::push_back
                  (circuit,(unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>
                            *)&local_50);
        if ((QRotationGate1<std::complex<float>_> *)local_50._M_head_impl !=
            (QRotationGate1<std::complex<float>_> *)0x0) {
          (*(((QGate1<std::complex<float>_> *)&(local_50._M_head_impl)->_vptr_QObject)->
            super_QObject<std::complex<float>_>)._vptr_QObject[0xd])();
        }
        local_50._M_head_impl = (QObject<std::complex<float>_> *)0x0;
        pCVar2 = (CX<std::complex<float>_> *)operator_new(0x18);
        qclab::qgates::CX<std::complex<float>_>::CX(pCVar2,qubit_00,qubit,1);
        local_58._M_head_impl = (QObject<std::complex<float>_> *)pCVar2;
        qclab::QCircuit<std::complex<float>,_qclab::QObject<std::complex<float>_>_>::push_back
                  (circuit,(unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>
                            *)&local_58);
        if ((CX<std::complex<float>_> *)local_58._M_head_impl != (CX<std::complex<float>_> *)0x0) {
          (*(((QControlledGate2<std::complex<float>_> *)&(local_58._M_head_impl)->_vptr_QObject)->
            super_QGate2<std::complex<float>_>).super_QObject<std::complex<float>_>._vptr_QObject
            [0xd])();
        }
        local_58._M_head_impl = (QObject<std::complex<float>_> *)0x0;
        pQVar1 = (QRotationGate1<std::complex<float>_> *)operator_new(0x18);
        qclab::qgates::QRotationGate1<std::complex<float>_>::QRotationGate1
                  (pQVar1,qubit_00,3.1415927,false);
        (pQVar1->super_QGate1<std::complex<float>_>).super_QObject<std::complex<float>_>.
        _vptr_QObject = (_func_int **)&PTR_nbQubits_00122f28;
        local_60._M_head_impl = (QObject<std::complex<float>_> *)pQVar1;
        qclab::QCircuit<std::complex<float>,_qclab::QObject<std::complex<float>_>_>::push_back
                  (circuit,(unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>
                            *)&local_60);
        if ((QRotationGate1<std::complex<float>_> *)local_60._M_head_impl !=
            (QRotationGate1<std::complex<float>_> *)0x0) {
          (*(((QGate1<std::complex<float>_> *)&(local_60._M_head_impl)->_vptr_QObject)->
            super_QObject<std::complex<float>_>)._vptr_QObject[0xd])();
        }
        local_60._M_head_impl = (QObject<std::complex<float>_> *)0x0;
        pQVar1 = (QRotationGate1<std::complex<float>_> *)operator_new(0x18);
        qclab::qgates::QRotationGate1<std::complex<float>_>::QRotationGate1
                  (pQVar1,qubit,3.1415927,false);
        (pQVar1->super_QGate1<std::complex<float>_>).super_QObject<std::complex<float>_>.
        _vptr_QObject = (_func_int **)&PTR_nbQubits_00122d28;
        local_68._M_head_impl = (QObject<std::complex<float>_> *)pQVar1;
        qclab::QCircuit<std::complex<float>,_qclab::QObject<std::complex<float>_>_>::push_back
                  (circuit,(unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>
                            *)&local_68);
        if ((QRotationGate1<std::complex<float>_> *)local_68._M_head_impl !=
            (QRotationGate1<std::complex<float>_> *)0x0) {
          (*(((QGate1<std::complex<float>_> *)&(local_68._M_head_impl)->_vptr_QObject)->
            super_QObject<std::complex<float>_>)._vptr_QObject[0xd])();
        }
        local_68._M_head_impl = (QObject<std::complex<float>_> *)0x0;
        pCVar2 = (CX<std::complex<float>_> *)operator_new(0x18);
        qclab::qgates::CX<std::complex<float>_>::CX(pCVar2,qubit_00,qubit,1);
        local_70._M_head_impl = (QObject<std::complex<float>_> *)pCVar2;
        qclab::QCircuit<std::complex<float>,_qclab::QObject<std::complex<float>_>_>::push_back
                  (circuit,(unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>
                            *)&local_70);
        if ((CX<std::complex<float>_> *)local_70._M_head_impl != (CX<std::complex<float>_> *)0x0) {
          (*(((QControlledGate2<std::complex<float>_> *)&(local_70._M_head_impl)->_vptr_QObject)->
            super_QGate2<std::complex<float>_>).super_QObject<std::complex<float>_>._vptr_QObject
            [0xd])();
        }
        local_70._M_head_impl = (QObject<std::complex<float>_> *)0x0;
        pQVar1 = (QRotationGate1<std::complex<float>_> *)operator_new(0x18);
        qclab::qgates::QRotationGate1<std::complex<float>_>::QRotationGate1
                  (pQVar1,qubit_00,-1.5707964,false);
        (pQVar1->super_QGate1<std::complex<float>_>).super_QObject<std::complex<float>_>.
        _vptr_QObject = (_func_int **)&PTR_nbQubits_00122f28;
        local_78._M_head_impl = (QObject<std::complex<float>_> *)pQVar1;
        qclab::QCircuit<std::complex<float>,_qclab::QObject<std::complex<float>_>_>::push_back
                  (circuit,(unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>
                            *)&local_78);
        if ((QRotationGate1<std::complex<float>_> *)local_78._M_head_impl !=
            (QRotationGate1<std::complex<float>_> *)0x0) {
          (*(((QGate1<std::complex<float>_> *)&(local_78._M_head_impl)->_vptr_QObject)->
            super_QObject<std::complex<float>_>)._vptr_QObject[0xd])();
        }
        local_78._M_head_impl = (QObject<std::complex<float>_> *)0x0;
        pQVar1 = (QRotationGate1<std::complex<float>_> *)operator_new(0x18);
        qclab::qgates::QRotationGate1<std::complex<float>_>::QRotationGate1
                  (pQVar1,qubit,-1.5707964,false);
        (pQVar1->super_QGate1<std::complex<float>_>).super_QObject<std::complex<float>_>.
        _vptr_QObject = (_func_int **)&PTR_nbQubits_00122f28;
        local_80._M_head_impl = (QObject<std::complex<float>_> *)pQVar1;
        qclab::QCircuit<std::complex<float>,_qclab::QObject<std::complex<float>_>_>::push_back
                  (circuit,(unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>
                            *)&local_80);
        if ((QRotationGate1<std::complex<float>_> *)local_80._M_head_impl !=
            (QRotationGate1<std::complex<float>_> *)0x0) {
          (*(((QGate1<std::complex<float>_> *)&(local_80._M_head_impl)->_vptr_QObject)->
            super_QObject<std::complex<float>_>)._vptr_QObject[0xd])();
        }
        local_80._M_head_impl = (QObject<std::complex<float>_> *)0x0;
      }
      local_34 = local_34 + 1;
    } while (local_34 != local_38);
  }
  return;
}

Assistant:

void trotter( qclab::QCircuit< T >& circuit ) {

  using R  = qclab::real_t< T > ;
  using RX = qclab::qgates::RotationX< T > ;
  using RZ = qclab::qgates::RotationZ< T > ;
  using CX = qclab::qgates::CNOT< T > ;

  // constants
  const R pi = 4 * std::atan(1) ;
  const int n = circuit.nbQubits() ;

  // layers
  for ( int lyr = 0; lyr < n; lyr++ ) {
    int os = ( lyr % 2 ) ? 1 : 0 ;        // offset at bottom
    int os_c = ( n % 2 ) ? 1 - os : os ;  // offset at top
    for ( int i = os; i < n - os_c; i++ ) {
      circuit.push_back( std::make_unique< RZ >( i , pi ) ) ;
    }
    for ( int i = os; i < n - os_c - 1; i += 2 ) {
      circuit.push_back( std::make_unique< RX >( i     , pi/2 ) ) ;
      circuit.push_back( std::make_unique< RX >( i + 1 , pi/2 ) ) ;
      circuit.push_back( std::make_unique< CX >( i , i + 1 ) ) ;
      circuit.push_back( std::make_unique< RX >( i     , pi ) ) ;
      circuit.push_back( std::make_unique< RZ >( i + 1 , pi ) ) ;
      circuit.push_back( std::make_unique< CX >( i , i + 1 ) ) ;
      circuit.push_back( std::make_unique< RX >( i     , -pi/2 ) ) ;
      circuit.push_back( std::make_unique< RX >( i + 1 , -pi/2 ) ) ;
    }
  }

}